

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfilesystemengine.cpp
# Opt level: O0

unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_>
QFileSystemEngine::createLegacyEngine(QFileSystemEntry *entry,QFileSystemMetaData *data)

{
  bool bVar1;
  QFileSystemMetaData *in_RDX;
  QFileSystemEntry *in_RSI;
  _Head_base<0UL,_QAbstractFileEngine_*,_false> in_RDI;
  long in_FS_OFFSET;
  unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *engine;
  QFileSystemEntry copy;
  QFileSystemEntry *in_stack_ffffffffffffff88;
  QFileSystemEntry *pQVar2;
  undefined7 in_stack_ffffffffffffffa0;
  undefined1 uVar3;
  undefined1 local_40 [56];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = (QFileSystemEntry *)in_RDI._M_head_impl;
  memset(local_40,0xaa,0x38);
  QFileSystemEntry::QFileSystemEntry
            ((QFileSystemEntry *)in_RDI._M_head_impl,in_stack_ffffffffffffff88);
  uVar3 = 0;
  (pQVar2->m_filePath).d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  std::unique_ptr<QAbstractFileEngine,std::default_delete<QAbstractFileEngine>>::
  unique_ptr<std::default_delete<QAbstractFileEngine>,void>
            ((unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
             in_RDI._M_head_impl);
  bVar1 = _q_createLegacyEngine_recursive
                    (in_RSI,in_RDX,
                     (unique_ptr<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>_> *)
                     CONCAT17(uVar3,in_stack_ffffffffffffffa0),SUB81((ulong)pQVar2 >> 0x38,0));
  if (bVar1) {
    QFileSystemEntry::operator=((QFileSystemEntry *)in_RDI._M_head_impl,in_stack_ffffffffffffff88);
  }
  else {
    QFileSystemMetaData::clear((QFileSystemMetaData *)in_RDI._M_head_impl);
  }
  QFileSystemEntry::~QFileSystemEntry((QFileSystemEntry *)in_RDI._M_head_impl);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return (__uniq_ptr_data<QAbstractFileEngine,_std::default_delete<QAbstractFileEngine>,_true,_true>
         )(tuple<QAbstractFileEngine_*,_std::default_delete<QAbstractFileEngine>_>)
          in_RDI._M_head_impl;
}

Assistant:

std::unique_ptr<QAbstractFileEngine>
QFileSystemEngine::createLegacyEngine(QFileSystemEntry &entry, QFileSystemMetaData &data)
{
    QFileSystemEntry copy = entry;
    std::unique_ptr<QAbstractFileEngine> engine;

    if (_q_createLegacyEngine_recursive(copy, data, engine))
        // Reset entry to resolved copy.
        entry = copy;
    else
        data.clear();

    return engine;
}